

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_mbrxc_bg.c
# Opt level: O1

double xc_mgga_x_mbrxc_get_x(double Q)

{
  double dVar1;
  double rhs;
  double local_8;
  
  if (ABS(Q) < 5e-12) {
    return 3.0;
  }
  local_8 = 21.620541520507917 / (Q * 6.0);
  dVar1 = 3.0;
  if (0.0 < local_8) {
    dVar1 = 2.0 / local_8 + 3.0;
  }
  dVar1 = xc_math_brent(mbrxc_x_Q,*(double *)(&DAT_00f9a070 + (ulong)(0.0 < local_8) * 8),dVar1,
                        5e-12,500.0,&local_8);
  return dVar1;
}

Assistant:

GPU_FUNCTION
double xc_mgga_x_mbrxc_get_x(double Q)
{
  double rhs, tol, x1, x2;

  tol = 5e-12;
  if(fabs(Q) < 5e-12)
    return 3.0;

  /* build right-hand side of the non-linear equation
     Remember we use a different definition of tau */
  rhs = pow(32.0*M_PI, 2.0/3.0)/(6.0*Q);

  /* starting interval */
  if(rhs > 0.0) {
    /* I checked that the solution is always in this interval */
    x1 = 3.0;
    x2 = 2.0/rhs + 3.0;
  }else{
    x2 = 3.0;
    x1 = -1.0;
  }

  return xc_math_brent(mbrxc_x_Q, x1, x2, tol, 500, &rhs);
}